

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChForce.cpp
# Opt level: O1

void __thiscall chrono::ChForce::SetDir(ChForce *this,ChVector<double> *newf)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ChBody *pCVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  dVar1 = newf->m_data[0];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar1;
  dVar2 = newf->m_data[1];
  dVar3 = newf->m_data[2];
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar3;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar2 * dVar2;
  auVar15 = vfmadd231sd_fma(auVar15,auVar16,auVar16);
  auVar15 = vfmadd231sd_fma(auVar15,auVar19,auVar19);
  if (auVar15._0_8_ < 0.0) {
    dVar14 = sqrt(auVar15._0_8_);
  }
  else {
    auVar15 = vsqrtsd_avx(auVar15,auVar15);
    dVar14 = auVar15._0_8_;
  }
  bVar11 = 2.2250738585072014e-308 <= dVar14;
  dVar14 = 1.0 / dVar14;
  dVar2 = (double)((ulong)bVar11 * (long)(dVar2 * dVar14));
  auVar12._0_8_ =
       (double)((ulong)bVar11 * (long)(dVar1 * dVar14) + (ulong)!bVar11 * 0x3ff0000000000000);
  auVar12._8_8_ = 0;
  dVar1 = (double)((ulong)bVar11 * (long)(dVar3 * dVar14));
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar1;
  (this->vdir).m_data[0] = auVar12._0_8_;
  (this->vdir).m_data[1] = dVar2;
  (this->vdir).m_data[2] = dVar1;
  pCVar10 = this->Body;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(double *)
                  ((long)&(pCVar10->super_ChBodyFrame).super_ChFrameMoving<double>.
                          super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage +
                  0x10);
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       dVar2 * *(double *)
                ((long)&(pCVar10->super_ChBodyFrame).super_ChFrameMoving<double>.
                        super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage +
                0x28);
  auVar15 = vfmadd231sd_fma(auVar17,auVar12,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(double *)
                  ((long)&(pCVar10->super_ChBodyFrame).super_ChFrameMoving<double>.
                          super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage +
                  0x40);
  auVar15 = vfmadd231sd_fma(auVar15,auVar13,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(double *)
                  ((long)&(pCVar10->super_ChBodyFrame).super_ChFrameMoving<double>.
                          super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage + 8
                  );
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       dVar2 * *(double *)
                ((long)&(pCVar10->super_ChBodyFrame).super_ChFrameMoving<double>.
                        super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage +
                0x20);
  auVar16 = vfmadd231sd_fma(auVar20,auVar12,auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(double *)
                  ((long)&(pCVar10->super_ChBodyFrame).super_ChFrameMoving<double>.
                          super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage +
                  0x38);
  auVar16 = vfmadd231sd_fma(auVar16,auVar13,auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (pCVar10->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                 Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       dVar2 * *(double *)
                ((long)&(pCVar10->super_ChBodyFrame).super_ChFrameMoving<double>.
                        super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage +
                0x18);
  auVar19 = vfmadd231sd_fma(auVar18,auVar12,auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(double *)
                  ((long)&(pCVar10->super_ChBodyFrame).super_ChFrameMoving<double>.
                          super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage +
                  0x30);
  auVar19 = vfmadd231sd_fma(auVar19,auVar13,auVar9);
  (this->vreldir).m_data[0] = auVar19._0_8_;
  (this->vreldir).m_data[1] = auVar16._0_8_;
  (this->vreldir).m_data[2] = auVar15._0_8_;
  UpdateState(this);
  return;
}

Assistant:

void ChForce::SetDir(ChVector<> newf) {
    vdir = Vnorm(newf);
    vreldir = GetBody()->TransformDirectionParentToLocal(vdir);
    UpdateState();  // update also F
}